

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-stats.cc
# Opt level: O2

Result __thiscall
wabt::(anonymous_namespace)::BinaryReaderOpcnt::
Emplace<wabt::Opcode&,wabt::OpcodeInfo::Kind,unsigned_long*>
          (BinaryReaderOpcnt *this,Opcode *args,Kind *args_1,unsigned_long **args_2)

{
  pair<std::_Rb_tree_iterator<std::pair<const_wabt::OpcodeInfo,_unsigned_long>_>,_bool> pVar1;
  _Head_base<0UL,_int,_false> local_14;
  tuple<wabt::Opcode,_wabt::OpcodeInfo::Kind,_unsigned_long_*> local_10;
  
  local_10.super__Tuple_impl<0UL,_wabt::Opcode,_wabt::OpcodeInfo::Kind,_unsigned_long_*>.
  super__Tuple_impl<1UL,_wabt::OpcodeInfo::Kind,_unsigned_long_*>.
  super__Tuple_impl<2UL,_unsigned_long_*>.super__Head_base<2UL,_unsigned_long_*,_false>._M_head_impl
       = (_Head_base<2UL,_unsigned_long_*,_false>)*args_2;
  local_10.super__Tuple_impl<0UL,_wabt::Opcode,_wabt::OpcodeInfo::Kind,_unsigned_long_*>.
  super__Tuple_impl<1UL,_wabt::OpcodeInfo::Kind,_unsigned_long_*>.
  super__Head_base<1UL,_wabt::OpcodeInfo::Kind,_false>._M_head_impl = *args_1;
  local_10.super__Tuple_impl<0UL,_wabt::Opcode,_wabt::OpcodeInfo::Kind,_unsigned_long_*>.
  super__Tuple_impl<1UL,_wabt::OpcodeInfo::Kind,_unsigned_long_*>._12_4_ = args->enum_;
  local_14._M_head_impl = 0;
  pVar1 = std::
          _Rb_tree<wabt::OpcodeInfo,std::pair<wabt::OpcodeInfo_const,unsigned_long>,std::_Select1st<std::pair<wabt::OpcodeInfo_const,unsigned_long>>,std::less<wabt::OpcodeInfo>,std::allocator<std::pair<wabt::OpcodeInfo_const,unsigned_long>>>
          ::
          _M_emplace_unique<std::piecewise_construct_t_const&,std::tuple<wabt::Opcode,wabt::OpcodeInfo::Kind,unsigned_long*>,std::tuple<int>>
                    (*(_Rb_tree<wabt::OpcodeInfo,std::pair<wabt::OpcodeInfo_const,unsigned_long>,std::_Select1st<std::pair<wabt::OpcodeInfo_const,unsigned_long>>,std::less<wabt::OpcodeInfo>,std::allocator<std::pair<wabt::OpcodeInfo_const,unsigned_long>>>
                       **)(this + 0x10),(piecewise_construct_t *)&std::piecewise_construct,&local_10
                     ,(tuple<int> *)&local_14);
  *(long *)(pVar1.first._M_node._M_node + 2) = *(long *)(pVar1.first._M_node._M_node + 2) + 1;
  return (Result)Ok;
}

Assistant:

Result BinaryReaderOpcnt::Emplace(Args&&... args) {
  auto pair = opcode_counts_->emplace(
      std::piecewise_construct, std::make_tuple(std::forward<Args>(args)...),
      std::make_tuple(0));

  auto& count = pair.first->second;
  count++;
  return Result::Ok;
}